

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

BignumCarry
mp_add_masked_into(BignumInt *w_out,size_t rw,mp_int *a,mp_int *b,BignumInt b_and,BignumInt b_xor,
                  BignumCarry carry)

{
  BignumInt BVar1;
  BignumInt BVar2;
  ulong uVar3;
  ulong uVar4;
  BignumDblInt ADC_temp;
  BignumInt out;
  BignumInt bword;
  BignumInt aword;
  size_t i;
  BignumInt b_xor_local;
  BignumInt b_and_local;
  mp_int *b_local;
  mp_int *a_local;
  size_t rw_local;
  BignumInt *w_out_local;
  
  for (aword = 0; aword < rw; aword = aword + 1) {
    BVar1 = mp_word(a,aword);
    BVar2 = mp_word(b,aword);
    uVar3 = BVar2 & b_and ^ b_xor;
    uVar4 = BVar1 + uVar3;
    BVar2 = uVar4 + carry;
    carry = (ulong)CARRY8(BVar1,uVar3) + (ulong)CARRY8(uVar4,carry);
    if (w_out != (BignumInt *)0x0) {
      w_out[aword] = BVar2;
    }
  }
  return carry;
}

Assistant:

static BignumCarry mp_add_masked_into(
    BignumInt *w_out, size_t rw, mp_int *a, mp_int *b,
    BignumInt b_and, BignumInt b_xor, BignumCarry carry)
{
    for (size_t i = 0; i < rw; i++) {
        BignumInt aword = mp_word(a, i), bword = mp_word(b, i), out;
        bword = (bword & b_and) ^ b_xor;
        BignumADC(out, carry, aword, bword, carry);
        if (w_out)
            w_out[i] = out;
    }
    return carry;
}